

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcgen.cpp
# Opt level: O3

ulong __thiscall CTcDataStream::reserve(CTcDataStream *this,size_t len)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  
  uVar1 = this->ofs_;
  uVar2 = this->rem_;
  uVar3 = uVar1;
  if (uVar2 < len) {
    do {
      if (uVar2 == 0) {
        alloc_page(this);
        uVar3 = this->ofs_;
        uVar2 = this->rem_;
      }
      uVar4 = uVar2;
      if (len < uVar2) {
        uVar4 = len;
      }
      this->ofs_ = uVar3 + uVar4;
      this->wp_ = this->wp_ + uVar4;
      uVar2 = uVar2 - uVar4;
      this->rem_ = uVar2;
      len = len - uVar4;
      uVar3 = uVar3 + uVar4;
    } while (len != 0);
  }
  else {
    this->ofs_ = uVar1 + len;
    this->wp_ = this->wp_ + len;
    this->rem_ = uVar2 - len;
  }
  return uVar1;
}

Assistant:

ulong CTcDataStream::reserve(size_t len)
{
    ulong ret;

    /* we'll always return the offset current before the call */
    ret = ofs_;
    
    /* if we have space on the current page, it's easy */
    if (len <= rem_)
    {
        /* advance the output pointers */
        ofs_ += len;
        wp_ += len;
        rem_ -= len;
    }
    else
    {
        /* keep going until we satisfy the request */
        do
        {
            size_t cur;

            /* if necessary, allocate more memory */
            if (rem_ == 0)
                alloc_page();

            /* limit this chunk to the space remaining on the current page */
            cur = len;
            if (cur > rem_)
                cur = rem_;

            /* skip past this chunk */
            ofs_ += cur;
            wp_ += cur;
            rem_ -= cur;
            len -= cur;

        } while (len != 0);
    }

    /* return the starting offset */
    return ret;
}